

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_striped_sse2_128_8.c
# Opt level: O0

parasail_result_t *
parasail_sg_flags_striped_profile_sse2_128_8
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  int iVar1;
  parasail_matrix_t *ppVar2;
  void *pvVar3;
  longlong lVar4;
  longlong lVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  longlong lVar10;
  longlong lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  __m128i *palVar21;
  __m128i *palVar22;
  char cVar23;
  char cVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  __m128i *ptr;
  int8_t *ptr_00;
  uint uVar28;
  ulong extraout_RDX;
  longlong lVar29;
  ulong extraout_RDX_00;
  size_t size;
  longlong extraout_XMM0_Qa;
  longlong extraout_XMM0_Qa_00;
  longlong extraout_XMM0_Qa_01;
  longlong extraout_XMM0_Qa_02;
  longlong extraout_XMM0_Qa_03;
  undefined8 extraout_XMM0_Qa_04;
  undefined8 extraout_XMM0_Qa_05;
  longlong extraout_XMM0_Qa_06;
  longlong extraout_XMM0_Qa_07;
  longlong extraout_XMM0_Qa_08;
  longlong extraout_XMM0_Qa_09;
  longlong extraout_XMM0_Qb;
  longlong extraout_XMM0_Qb_00;
  longlong extraout_XMM0_Qb_01;
  longlong extraout_XMM0_Qb_02;
  longlong extraout_XMM0_Qb_03;
  undefined8 extraout_XMM0_Qb_04;
  undefined8 extraout_XMM0_Qb_05;
  longlong extraout_XMM0_Qb_06;
  longlong extraout_XMM0_Qb_07;
  longlong extraout_XMM0_Qb_08;
  undefined1 auVar30 [16];
  ulong uVar31;
  longlong extraout_XMM0_Qb_09;
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  __m128i a_03;
  __m128i a_04;
  __m128i a_05;
  __m128i a_06;
  __m128i a_07;
  __m128i a_08;
  __m128i a_09;
  __m128i a_10;
  __m128i a_11;
  __m128i a_12;
  __m128i alVar32;
  __m128i alVar33;
  __m128i alVar34;
  __m128i b;
  __m128i b_00;
  __m128i b_01;
  __m128i b_02;
  __m128i b_03;
  __m128i b_04;
  __m128i b_05;
  __m128i b_06;
  __m128i b_07;
  __m128i b_08;
  __m128i b_09;
  int local_59c;
  int local_58c;
  long local_588;
  long local_580;
  int local_578;
  __m128i vH_1;
  int32_t temp;
  int32_t column_len;
  int8_t *t;
  __m128i vCompare;
  int8_t tmp2;
  int64_t tmp_2;
  __m128i *pv;
  __m128i *vP;
  __m128i vH;
  __m128i vF;
  __m128i vE;
  int64_t tmp_1;
  int64_t tmp;
  __m128i_8_t e;
  __m128i_8_t h;
  int32_t segNum;
  int32_t index;
  parasail_result_t *result;
  __m128i vPosMask;
  __m128i vMaxH;
  __m128i vSaturationCheckMax;
  __m128i vSaturationCheckMin;
  __m128i vPosLimit;
  __m128i vNegLimit;
  char local_43b;
  int8_t score;
  int8_t POS_LIMIT;
  int8_t NEG_LIMIT;
  __m128i vGapE;
  __m128i vGapO;
  int8_t *boundary;
  __m128i *pvE;
  __m128i *pvHLoad;
  __m128i *pvHStore;
  __m128i *vProfile;
  int32_t position;
  int32_t offset;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int32_t end_ref;
  int32_t end_query;
  int32_t s1Len;
  int32_t k;
  int32_t j;
  int32_t i;
  int s1_beg_local;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *s2_local;
  parasail_profile_t *profile_local;
  char local_d8;
  char cStack_d7;
  char cStack_d6;
  char cStack_d5;
  char cStack_d4;
  char cStack_d3;
  char cStack_d2;
  char cStack_d1;
  char cStack_d0;
  char cStack_cf;
  char cStack_ce;
  char cStack_cd;
  char cStack_cc;
  char cStack_cb;
  char cStack_ca;
  char cStack_c9;
  char local_c8;
  char cStack_c7;
  char cStack_c6;
  char cStack_c5;
  char cStack_c4;
  char cStack_c3;
  char cStack_c2;
  char cStack_c1;
  char cStack_c0;
  char cStack_bf;
  char cStack_be;
  char cStack_bd;
  char cStack_bc;
  char cStack_bb;
  char cStack_ba;
  char cStack_b9;
  char local_b8;
  char cStack_b7;
  char cStack_b6;
  char cStack_b5;
  char cStack_b4;
  char cStack_b3;
  char cStack_b2;
  char cStack_b1;
  char cStack_b0;
  char cStack_af;
  char cStack_ae;
  char cStack_ad;
  char cStack_ac;
  char cStack_ab;
  char cStack_aa;
  char cStack_a9;
  char local_a8;
  char cStack_a7;
  char cStack_a6;
  char cStack_a5;
  char cStack_a4;
  char cStack_a3;
  char cStack_a2;
  char cStack_a1;
  char cStack_a0;
  char cStack_9f;
  char cStack_9e;
  char cStack_9d;
  char cStack_9c;
  char cStack_9b;
  char cStack_9a;
  char cStack_99;
  char local_98;
  char cStack_97;
  char cStack_96;
  char cStack_95;
  char cStack_94;
  char cStack_93;
  char cStack_92;
  char cStack_91;
  char cStack_90;
  char cStack_8f;
  char cStack_8e;
  char cStack_8d;
  char cStack_8c;
  char cStack_8b;
  char cStack_8a;
  char cStack_89;
  char local_28;
  char cStack_27;
  char cStack_26;
  char cStack_25;
  char cStack_24;
  char cStack_23;
  char cStack_22;
  char cStack_21;
  char cStack_20;
  char cStack_1f;
  char cStack_1e;
  char cStack_1d;
  char cStack_1c;
  char cStack_1b;
  char cStack_1a;
  char cStack_19;
  
  _segNum = (parasail_profile_t *)0x0;
  if (profile == (parasail_profile_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_striped_profile_sse2_128_8","profile");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if ((profile->profile8).score == (void *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_striped_profile_sse2_128_8",
            "profile->profile8.score");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_striped_profile_sse2_128_8",
            "profile->matrix");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->s1Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sg_flags_striped_profile_sse2_128_8",
            "profile->s1Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_striped_profile_sse2_128_8","s2");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sg_flags_striped_profile_sse2_128_8","s2Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sg_flags_striped_profile_sse2_128_8","open");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sg_flags_striped_profile_sse2_128_8","gap");
    profile_local = (parasail_profile_t *)0x0;
  }
  else {
    iVar1 = profile->s1Len;
    matrix._0_4_ = s2Len + -1;
    ppVar2 = profile->matrix;
    iVar25 = (iVar1 + 0xf) / 0x10;
    iVar26 = ~((iVar1 + -1) / iVar25) + 0x10;
    pvVar3 = (profile->profile8).score;
    s1_beg_local._0_1_ = (char)open;
    uVar6 = CONCAT17((char)s1_beg_local,
                     CONCAT16((char)s1_beg_local,
                              CONCAT15((char)s1_beg_local,
                                       CONCAT14((char)s1_beg_local,
                                                CONCAT13((char)s1_beg_local,
                                                         CONCAT12((char)s1_beg_local,
                                                                  CONCAT11((char)s1_beg_local,
                                                                           (char)s1_beg_local)))))))
    ;
    uVar7 = CONCAT17((char)s1_beg_local,
                     CONCAT16((char)s1_beg_local,
                              CONCAT15((char)s1_beg_local,
                                       CONCAT14((char)s1_beg_local,
                                                CONCAT13((char)s1_beg_local,
                                                         CONCAT12((char)s1_beg_local,
                                                                  CONCAT11((char)s1_beg_local,
                                                                           (char)s1_beg_local)))))))
    ;
    i._0_1_ = (undefined1)gap;
    uVar8 = CONCAT17((undefined1)i,
                     CONCAT16((undefined1)i,
                              CONCAT15((undefined1)i,
                                       CONCAT14((undefined1)i,
                                                CONCAT13((undefined1)i,
                                                         CONCAT12((undefined1)i,
                                                                  CONCAT11((undefined1)i,
                                                                           (undefined1)i)))))));
    uVar9 = CONCAT17((undefined1)i,
                     CONCAT16((undefined1)i,
                              CONCAT15((undefined1)i,
                                       CONCAT14((undefined1)i,
                                                CONCAT13((undefined1)i,
                                                         CONCAT12((undefined1)i,
                                                                  CONCAT11((undefined1)i,
                                                                           (undefined1)i)))))));
    if (ppVar2->min <= -open) {
      s1_beg_local._0_1_ = -(char)ppVar2->min;
    }
    cVar23 = (char)s1_beg_local + -0x7f;
    cVar24 = ((byte)ppVar2->max ^ 0x7f) - 1;
    lVar10 = CONCAT17(cVar23,CONCAT16(cVar23,CONCAT15(cVar23,CONCAT14(cVar23,CONCAT13(cVar23,
                                                  CONCAT12(cVar23,CONCAT11(cVar23,cVar23)))))));
    lVar11 = CONCAT17(cVar23,CONCAT16(cVar23,CONCAT15(cVar23,CONCAT14(cVar23,CONCAT13(cVar23,
                                                  CONCAT12(cVar23,CONCAT11(cVar23,cVar23)))))));
    vSaturationCheckMax[1] =
         CONCAT17(cVar24,CONCAT16(cVar24,CONCAT15(cVar24,CONCAT14(cVar24,CONCAT13(cVar24,CONCAT12(
                                                  cVar24,CONCAT11(cVar24,cVar24)))))));
    vSaturationCheckMin[0] =
         CONCAT17(cVar24,CONCAT16(cVar24,CONCAT15(cVar24,CONCAT14(cVar24,CONCAT13(cVar24,CONCAT12(
                                                  cVar24,CONCAT11(cVar24,cVar24)))))));
    vProfile._0_1_ = (char)iVar26;
    result._0_1_ = -((char)vProfile == '\x0f');
    result._1_1_ = -((char)vProfile == '\x0e');
    result._2_1_ = -((char)vProfile == '\r');
    result._3_1_ = -((char)vProfile == '\f');
    result._4_1_ = -((char)vProfile == '\v');
    result._5_1_ = -((char)vProfile == '\n');
    result._6_1_ = -((char)vProfile == '\t');
    result._7_1_ = -((char)vProfile == '\b');
    vPosMask[0]._0_1_ = -((char)vProfile == '\a');
    vPosMask[0]._1_1_ = -((char)vProfile == '\x06');
    vPosMask[0]._2_1_ = -((char)vProfile == '\x05');
    vPosMask[0]._3_1_ = -((char)vProfile == '\x04');
    vPosMask[0]._4_1_ = -((char)vProfile == '\x03');
    vPosMask[0]._5_1_ = -((char)vProfile == '\x02');
    vPosMask[0]._6_1_ = -((char)vProfile == '\x01');
    vPosMask[0]._7_1_ = -((char)vProfile == '\0');
    vPosMask[1] = lVar10;
    _segNum = (parasail_profile_t *)parasail_result_new();
    if (_segNum == (parasail_profile_t *)0x0) {
      profile_local = (parasail_profile_t *)0x0;
    }
    else {
      *(uint *)&_segNum->field_0xc = *(uint *)&_segNum->field_0xc | 0x10100802;
      uVar28 = 0;
      if (s1_beg != 0) {
        uVar28 = 8;
      }
      *(uint *)&_segNum->field_0xc = uVar28 | *(uint *)&_segNum->field_0xc;
      uVar28 = 0;
      if (s1_end != 0) {
        uVar28 = 0x10;
      }
      *(uint *)&_segNum->field_0xc = uVar28 | *(uint *)&_segNum->field_0xc;
      uVar28 = 0;
      if (s2_beg != 0) {
        uVar28 = 0x4000;
      }
      *(uint *)&_segNum->field_0xc = uVar28 | *(uint *)&_segNum->field_0xc;
      uVar28 = 0;
      if (s2_end != 0) {
        uVar28 = 0x8000;
      }
      *(uint *)&_segNum->field_0xc = uVar28 | *(uint *)&_segNum->field_0xc;
      pvHLoad = parasail_memalign___m128i(0x10,(long)iVar25);
      pvE = parasail_memalign___m128i(0x10,(long)iVar25);
      ptr = parasail_memalign___m128i(0x10,(long)iVar25);
      size = (size_t)(s2Len + 1);
      ptr_00 = parasail_memalign_int8_t(0x10,size);
      if (pvHLoad == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvE == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_00 == (int8_t *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else {
        h.m[1]._4_4_ = 0;
        alVar32[0] = extraout_RDX;
        for (k = 0; k < iVar25; k = k + 1) {
          for (h.m[1]._0_4_ = 0; (int)h.m[1]._0_4_ < 0x10; h.m[1]._0_4_ = h.m[1]._0_4_ + 1) {
            if (s1_beg == 0) {
              uVar28 = h.m[1]._0_4_ * iVar25 + k;
              alVar32[0] = (ulong)uVar28;
              local_578 = -(gap * uVar28) - open;
            }
            else {
              local_578 = 0;
            }
            local_588 = (long)local_578;
            local_580 = local_588;
            if (local_588 < -0x80) {
              local_580 = -0x80;
            }
            e.v[(long)(int)h.m[1]._0_4_ + 8] = (int8_t)local_580;
            local_588 = local_588 - open;
            if (local_588 < -0x80) {
              local_588 = -0x80;
            }
            *(char *)((long)&tmp + (long)(int)h.m[1]._0_4_) = (char)local_588;
          }
          pvHLoad[(int)h.m[1]._4_4_][0] = e.m[1];
          pvHLoad[(int)h.m[1]._4_4_][1] = h.m[0];
          ptr[(int)h.m[1]._4_4_][0] = tmp;
          ptr[(int)h.m[1]._4_4_][1] = e.m[0];
          h.m[1]._4_4_ = h.m[1]._4_4_ + 1;
        }
        *ptr_00 = '\0';
        for (k = 1; k <= s2Len; k = k + 1) {
          if (s2_beg == 0) {
            alVar32[0] = (ulong)(k - 1U);
            local_58c = -(gap * (k - 1U)) - open;
          }
          else {
            local_58c = 0;
          }
          if (local_58c < -0x80) {
            local_58c = -0x80;
          }
          alVar32[0] = CONCAT71((int7)(alVar32[0] >> 8),(int8_t)local_58c);
          ptr_00[k] = (int8_t)local_58c;
        }
        vMaxH[0] = lVar11;
        vMaxH[1] = lVar10;
        vSaturationCheckMax[0] = lVar11;
        for (s1Len = 0; palVar22 = pvHLoad, palVar21 = pvE, s1Len < s2Len; s1Len = s1Len + 1) {
          vF[0] = lVar11;
          vH[1] = lVar10;
          iVar27 = ppVar2->mapper[(byte)s2[s1Len]];
          pvE = pvHLoad;
          pvHLoad = palVar21;
          alVar33[1] = (long)s1Len;
          size = 0;
          alVar34[0] = (ulong)(uint)(int)ptr_00[alVar33[1]];
          alVar34[1] = 0;
          alVar32 = _mm_insert_epi8_rpl(alVar34,s2[s1Len],s1Len);
          lVar29 = alVar32[1];
          vH[0] = extraout_XMM0_Qb;
          vP = (__m128i *)extraout_XMM0_Qa;
          alVar32[0] = alVar34[0];
          for (k = 0; k < iVar25; k = k + 1) {
            paddsb((undefined1  [16])_vP,
                   *(undefined1 (*) [16])
                    ((long)pvVar3 + (long)k * 0x10 + (long)(iVar27 * iVar25) * 0x10));
            b[1] = (long)k * 0x10;
            alVar34 = ptr[k];
            a[1] = size;
            a[0] = alVar32[0];
            b[0] = lVar29;
            alVar33 = _mm_max_epi8_rpl(a,b);
            b_00[0] = alVar33[1];
            a_00[1] = size;
            a_00[0] = alVar32[0];
            b_00[1] = b[1];
            alVar33 = _mm_max_epi8_rpl(a_00,b_00);
            b_01[0] = alVar33[1];
            b_01[1] = (long)k * 0x10;
            palVar21[k][0] = extraout_XMM0_Qa_00;
            palVar21[k][1] = extraout_XMM0_Qb_00;
            a_01[1] = size;
            a_01[0] = alVar32[0];
            alVar33 = _mm_max_epi8_rpl(a_01,b_01);
            b_02[0] = alVar33[1];
            a_02[1] = size;
            a_02[0] = alVar32[0];
            b_02[1] = b_01[1];
            alVar33 = _mm_min_epi8_rpl(a_02,b_02);
            b_03[0] = alVar33[1];
            a_03[1] = size;
            a_03[0] = alVar32[0];
            b_03[1] = b_01[1];
            alVar33 = _mm_min_epi8_rpl(a_03,b_03);
            b_04[0] = alVar33[1];
            a_04[1] = size;
            a_04[0] = alVar32[0];
            b_04[1] = b_01[1];
            alVar33 = _mm_min_epi8_rpl(a_04,b_04);
            b_05[0] = alVar33[1];
            auVar17._8_8_ = extraout_XMM0_Qb_00;
            auVar17._0_8_ = extraout_XMM0_Qa_00;
            auVar16._8_8_ = uVar7;
            auVar16._0_8_ = uVar6;
            psubsb(auVar17,auVar16);
            auVar15._8_8_ = uVar9;
            auVar15._0_8_ = uVar8;
            psubsb((undefined1  [16])alVar34,auVar15);
            a_05[1] = size;
            a_05[0] = alVar32[0];
            b_05[1] = b_01[1];
            alVar34 = _mm_max_epi8_rpl(a_05,b_05);
            b_06[0] = alVar34[1];
            b_06[1] = (long)k * 0x10;
            ptr[k][0] = extraout_XMM0_Qa_03;
            ptr[k][1] = extraout_XMM0_Qb_03;
            auVar30._8_8_ = uVar9;
            auVar30._0_8_ = uVar8;
            psubsb(stack0xfffffffffffffaf8,auVar30);
            a_06[1] = size;
            a_06[0] = alVar32[0];
            alVar34 = _mm_max_epi8_rpl(a_06,b_06);
            lVar29 = alVar34[1];
            vF[0] = extraout_XMM0_Qb_04;
            vH[1] = extraout_XMM0_Qa_04;
            alVar33[1] = (long)k * 0x10;
            _vP = palVar22[k];
            vMaxH[1] = extraout_XMM0_Qa_01;
            vSaturationCheckMax[0] = extraout_XMM0_Qb_01;
            vSaturationCheckMax[1] = extraout_XMM0_Qa_02;
            vSaturationCheckMin[0] = extraout_XMM0_Qb_02;
          }
          for (end_query = 0; end_query < 0x10; end_query = end_query + 1) {
            if (s2_beg == 0) {
              alVar33[1] = (long)(s1Len + 1);
              local_59c = ptr_00[alVar33[1]] - open;
            }
            else {
              local_59c = -open;
            }
            if (local_59c < -0x80) {
              local_59c = -0x80;
            }
            size = 0;
            alVar32[0] = (ulong)(uint)(int)(char)local_59c;
            alVar32[1] = 0;
            alVar34 = _mm_insert_epi8_rpl(alVar32,(int8_t)lVar29,(int)alVar33[1]);
            lVar29 = alVar34[1];
            vF[0] = extraout_XMM0_Qb_05;
            vH[1] = extraout_XMM0_Qa_05;
            for (k = 0; k < iVar25; k = k + 1) {
              b_07[1] = (long)k * 0x10;
              a_07[1] = size;
              a_07[0] = alVar32[0];
              b_07[0] = lVar29;
              alVar34 = _mm_max_epi8_rpl(a_07,b_07);
              alVar33[0] = alVar34[1];
              alVar33[1] = (long)k * 0x10;
              palVar21[k][0] = extraout_XMM0_Qa_06;
              palVar21[k][1] = extraout_XMM0_Qb_06;
              a_08[1] = size;
              a_08[0] = alVar32[0];
              alVar34 = _mm_min_epi8_rpl(a_08,alVar33);
              b_08[0] = alVar34[1];
              a_09[1] = size;
              a_09[0] = alVar32[0];
              b_08[1] = alVar33[1];
              alVar34 = _mm_max_epi8_rpl(a_09,b_08);
              lVar29 = alVar34[1];
              auVar14._8_8_ = extraout_XMM0_Qb_06;
              auVar14._0_8_ = extraout_XMM0_Qa_06;
              auVar13._8_8_ = uVar7;
              auVar13._0_8_ = uVar6;
              auVar30 = psubsb(auVar14,auVar13);
              auVar12._8_8_ = uVar9;
              auVar12._0_8_ = uVar8;
              register0x00001200 = psubsb(stack0xfffffffffffffaf8,auVar12);
              local_98 = (char)vH[1];
              cStack_97 = vH[1]._1_1_;
              cStack_96 = vH[1]._2_1_;
              cStack_95 = vH[1]._3_1_;
              cStack_94 = vH[1]._4_1_;
              cStack_93 = vH[1]._5_1_;
              cStack_92 = vH[1]._6_1_;
              cStack_91 = vH[1]._7_1_;
              cStack_90 = (char)vH[2];
              cStack_8f = vH[2]._1_1_;
              cStack_8e = vH[2]._2_1_;
              cStack_8d = vH[2]._3_1_;
              cStack_8c = vH[2]._4_1_;
              cStack_8b = vH[2]._5_1_;
              cStack_8a = vH[2]._6_1_;
              cStack_89 = vH[2]._7_1_;
              local_a8 = auVar30[0];
              cStack_a7 = auVar30[1];
              cStack_a6 = auVar30[2];
              cStack_a5 = auVar30[3];
              cStack_a4 = auVar30[4];
              cStack_a3 = auVar30[5];
              cStack_a2 = auVar30[6];
              cStack_a1 = auVar30[7];
              cStack_a0 = auVar30[8];
              cStack_9f = auVar30[9];
              cStack_9e = auVar30[10];
              cStack_9d = auVar30[0xb];
              cStack_9c = auVar30[0xc];
              cStack_9b = auVar30[0xd];
              cStack_9a = auVar30[0xe];
              cStack_99 = auVar30[0xf];
              auVar20[1] = -(cStack_a7 < cStack_97);
              auVar20[0] = -(local_a8 < local_98);
              auVar20[2] = -(cStack_a6 < cStack_96);
              auVar20[3] = -(cStack_a5 < cStack_95);
              auVar20[4] = -(cStack_a4 < cStack_94);
              auVar20[5] = -(cStack_a3 < cStack_93);
              auVar20[6] = -(cStack_a2 < cStack_92);
              auVar20[7] = -(cStack_a1 < cStack_91);
              auVar20[8] = -(cStack_a0 < cStack_90);
              auVar20[9] = -(cStack_9f < cStack_8f);
              auVar20[10] = -(cStack_9e < cStack_8e);
              auVar20[0xb] = -(cStack_9d < cStack_8d);
              auVar20[0xc] = -(cStack_9c < cStack_8c);
              auVar20[0xd] = -(cStack_9b < cStack_8b);
              auVar20[0xe] = -(cStack_9a < cStack_8a);
              auVar20[0xf] = -(cStack_99 < cStack_89);
              vMaxH[1] = extraout_XMM0_Qa_08;
              vSaturationCheckMax[0] = extraout_XMM0_Qb_08;
              vSaturationCheckMax[1] = extraout_XMM0_Qa_07;
              vSaturationCheckMin[0] = extraout_XMM0_Qb_07;
              if ((((((((((((((((auVar20 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                               (auVar20 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                              (auVar20 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                             (auVar20 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar20 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar20 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar20 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar20 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar20 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar20 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar20 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar20 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar20 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar20 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar20 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  cStack_99 >= cStack_89) goto LAB_005f5dd9;
            }
          }
LAB_005f5dd9:
          alVar33[1] = (long)((iVar1 + -1) % iVar25);
          b_09[1] = alVar33[1] * 0x10;
          lVar4 = palVar21[alVar33[1]][0];
          lVar5 = palVar21[alVar33[1]][1];
          alVar34[0] = CONCAT17(result._7_1_,
                                CONCAT16(result._6_1_,
                                         CONCAT15(result._5_1_,
                                                  CONCAT14(result._4_1_,
                                                           CONCAT13(result._3_1_,
                                                                    CONCAT12(result._2_1_,
                                                                             CONCAT11(result._1_1_,
                                                                                      (char)result))
                                                                   )))));
          local_b8 = (char)lVar4;
          cStack_b7 = (char)((ulong)lVar4 >> 8);
          cStack_b6 = (char)((ulong)lVar4 >> 0x10);
          cStack_b5 = (char)((ulong)lVar4 >> 0x18);
          cStack_b4 = (char)((ulong)lVar4 >> 0x20);
          cStack_b3 = (char)((ulong)lVar4 >> 0x28);
          cStack_b2 = (char)((ulong)lVar4 >> 0x30);
          cStack_b1 = (char)((ulong)lVar4 >> 0x38);
          cStack_b0 = (char)lVar5;
          cStack_af = (char)((ulong)lVar5 >> 8);
          cStack_ae = (char)((ulong)lVar5 >> 0x10);
          cStack_ad = (char)((ulong)lVar5 >> 0x18);
          cStack_ac = (char)((ulong)lVar5 >> 0x20);
          cStack_ab = (char)((ulong)lVar5 >> 0x28);
          cStack_aa = (char)((ulong)lVar5 >> 0x30);
          cStack_a9 = (char)((ulong)lVar5 >> 0x38);
          local_c8 = (char)vPosMask[1];
          cStack_c7 = (char)((ulong)vPosMask[1] >> 8);
          cStack_c6 = (char)((ulong)vPosMask[1] >> 0x10);
          cStack_c5 = (char)((ulong)vPosMask[1] >> 0x18);
          cStack_c4 = (char)((ulong)vPosMask[1] >> 0x20);
          cStack_c3 = (char)((ulong)vPosMask[1] >> 0x28);
          cStack_c2 = (char)((ulong)vPosMask[1] >> 0x30);
          cStack_c1 = (char)((ulong)vPosMask[1] >> 0x38);
          cStack_c0 = (char)vMaxH[0];
          cStack_bf = (char)((ulong)vMaxH[0] >> 8);
          cStack_be = (char)((ulong)vMaxH[0] >> 0x10);
          cStack_bd = (char)((ulong)vMaxH[0] >> 0x18);
          cStack_bc = (char)((ulong)vMaxH[0] >> 0x20);
          cStack_bb = (char)((ulong)vMaxH[0] >> 0x28);
          cStack_ba = (char)((ulong)vMaxH[0] >> 0x30);
          cStack_b9 = (char)((ulong)vMaxH[0] >> 0x38);
          uVar31 = CONCAT17(vPosMask[0]._7_1_,
                            CONCAT16(vPosMask[0]._6_1_,
                                     CONCAT15(vPosMask[0]._5_1_,
                                              CONCAT14(vPosMask[0]._4_1_,
                                                       CONCAT13(vPosMask[0]._3_1_,
                                                                CONCAT12(vPosMask[0]._2_1_,
                                                                         CONCAT11(vPosMask[0]._1_1_,
                                                                                  (char)vPosMask[0])
                                                                        )))))) &
                   CONCAT17(-(cStack_b9 < cStack_a9),
                            CONCAT16(-(cStack_ba < cStack_aa),
                                     CONCAT15(-(cStack_bb < cStack_ab),
                                              CONCAT14(-(cStack_bc < cStack_ac),
                                                       CONCAT13(-(cStack_bd < cStack_ad),
                                                                CONCAT12(-(cStack_be < cStack_ae),
                                                                         CONCAT11(-(cStack_bf <
                                                                                   cStack_af),
                                                                                  -(cStack_c0 <
                                                                                   cStack_b0))))))))
          ;
          a_10[1] = size;
          a_10[0] = alVar32[0];
          b_09[0] = lVar29;
          alVar32 = _mm_max_epi8_rpl(a_10,b_09);
          alVar32[0] = alVar32[1];
          auVar19._8_8_ = uVar31;
          auVar19._0_8_ =
               alVar34[0] &
               CONCAT17(-(cStack_c1 < cStack_b1),
                        CONCAT16(-(cStack_c2 < cStack_b2),
                                 CONCAT15(-(cStack_c3 < cStack_b3),
                                          CONCAT14(-(cStack_c4 < cStack_b4),
                                                   CONCAT13(-(cStack_c5 < cStack_b5),
                                                            CONCAT12(-(cStack_c6 < cStack_b6),
                                                                     CONCAT11(-(cStack_c7 <
                                                                               cStack_b7),
                                                                              -(local_c8 < local_b8)
                                                                             )))))));
          if ((((((((((((((((auVar19 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar19 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar19 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar19 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar19 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar19 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar19 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar19 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (uVar31 >> 7 & 1) != 0) || (uVar31 >> 0xf & 1) != 0) ||
                  (uVar31 >> 0x17 & 1) != 0) || (uVar31 >> 0x1f & 1) != 0) ||
                (uVar31 >> 0x27 & 1) != 0) || (uVar31 >> 0x2f & 1) != 0) ||
              (uVar31 >> 0x37 & 1) != 0) || (long)uVar31 < 0) {
            matrix._0_4_ = s1Len;
          }
          vPosMask[1] = extraout_XMM0_Qa_09;
          vMaxH[0] = extraout_XMM0_Qb_09;
        }
        local_43b = cVar23;
        if (s2_end != 0) {
          for (end_query = 0; end_query < iVar26; end_query = end_query + 1) {
            vPosMask[1] = vPosMask[1] << 8;
          }
          a_11[1] = size;
          a_11[0] = 0xf;
          local_43b = _mm_extract_epi8_rpl(a_11,(int)alVar32[0]);
          alVar32[0] = extraout_RDX_00;
        }
        matrix._4_4_ = iVar1 + -1;
        iVar27 = (int)alVar32[0];
        if (s1_end != 0) {
          _temp = pvHLoad;
          for (k = 0; iVar27 = (int)alVar32[0], k < iVar25 * 0x10; k = k + 1) {
            uVar28 = (k % 0x10) * iVar25;
            alVar32[0] = (ulong)uVar28;
            iVar27 = k / 0x10 + uVar28;
            if (iVar27 < iVar1) {
              if (local_43b < (char)(*_temp)[0]) {
                local_43b = (char)(*_temp)[0];
                matrix._0_4_ = s2Len + -1;
                matrix._4_4_ = iVar27;
              }
              else if ((((char)(*_temp)[0] == local_43b) && ((int)matrix == s2Len + -1)) &&
                      (iVar27 < matrix._4_4_)) {
                matrix._4_4_ = iVar27;
              }
            }
            _temp = (__m128i *)((long)*_temp + 1);
          }
        }
        if ((s1_end == 0) && (s2_end == 0)) {
          for (end_query = 0; end_query < iVar26; end_query = end_query + 1) {
          }
          a_12[1] = size;
          a_12[0] = 0xf;
          local_43b = _mm_extract_epi8_rpl(a_12,iVar27);
          matrix._0_4_ = s2Len + -1;
          matrix._4_4_ = iVar1 + -1;
        }
        local_28 = (char)vSaturationCheckMax[1];
        cStack_27 = (char)((ulong)vSaturationCheckMax[1] >> 8);
        cStack_26 = (char)((ulong)vSaturationCheckMax[1] >> 0x10);
        cStack_25 = (char)((ulong)vSaturationCheckMax[1] >> 0x18);
        cStack_24 = (char)((ulong)vSaturationCheckMax[1] >> 0x20);
        cStack_23 = (char)((ulong)vSaturationCheckMax[1] >> 0x28);
        cStack_22 = (char)((ulong)vSaturationCheckMax[1] >> 0x30);
        cStack_21 = (char)((ulong)vSaturationCheckMax[1] >> 0x38);
        cStack_20 = (char)vSaturationCheckMin[0];
        cStack_1f = (char)((ulong)vSaturationCheckMin[0] >> 8);
        cStack_1e = (char)((ulong)vSaturationCheckMin[0] >> 0x10);
        cStack_1d = (char)((ulong)vSaturationCheckMin[0] >> 0x18);
        cStack_1c = (char)((ulong)vSaturationCheckMin[0] >> 0x20);
        cStack_1b = (char)((ulong)vSaturationCheckMin[0] >> 0x28);
        cStack_1a = (char)((ulong)vSaturationCheckMin[0] >> 0x30);
        cStack_19 = (char)((ulong)vSaturationCheckMin[0] >> 0x38);
        local_d8 = (char)vMaxH[1];
        cStack_d7 = (char)((ulong)vMaxH[1] >> 8);
        cStack_d6 = (char)((ulong)vMaxH[1] >> 0x10);
        cStack_d5 = (char)((ulong)vMaxH[1] >> 0x18);
        cStack_d4 = (char)((ulong)vMaxH[1] >> 0x20);
        cStack_d3 = (char)((ulong)vMaxH[1] >> 0x28);
        cStack_d2 = (char)((ulong)vMaxH[1] >> 0x30);
        cStack_d1 = (char)((ulong)vMaxH[1] >> 0x38);
        cStack_d0 = (char)vSaturationCheckMax[0];
        cStack_cf = (char)((ulong)vSaturationCheckMax[0] >> 8);
        cStack_ce = (char)((ulong)vSaturationCheckMax[0] >> 0x10);
        cStack_cd = (char)((ulong)vSaturationCheckMax[0] >> 0x18);
        cStack_cc = (char)((ulong)vSaturationCheckMax[0] >> 0x20);
        cStack_cb = (char)((ulong)vSaturationCheckMax[0] >> 0x28);
        cStack_ca = (char)((ulong)vSaturationCheckMax[0] >> 0x30);
        cStack_c9 = (char)((ulong)vSaturationCheckMax[0] >> 0x38);
        alVar32[0] = CONCAT17(-(cStack_19 < cVar23),
                              CONCAT16(-(cStack_1a < cVar23),
                                       CONCAT15(-(cStack_1b < cVar23),
                                                CONCAT14(-(cStack_1c < cVar23),
                                                         CONCAT13(-(cStack_1d < cVar23),
                                                                  CONCAT12(-(cStack_1e < cVar23),
                                                                           CONCAT11(-(cStack_1f <
                                                                                     cVar23),-(
                                                  cStack_20 < cVar23)))))))) |
                     CONCAT17(-(cVar24 < cStack_c9),
                              CONCAT16(-(cVar24 < cStack_ca),
                                       CONCAT15(-(cVar24 < cStack_cb),
                                                CONCAT14(-(cVar24 < cStack_cc),
                                                         CONCAT13(-(cVar24 < cStack_cd),
                                                                  CONCAT12(-(cVar24 < cStack_ce),
                                                                           CONCAT11(-(cVar24 < 
                                                  cStack_cf),-(cVar24 < cStack_d0))))))));
        auVar18._8_8_ = alVar32[0];
        auVar18._0_8_ =
             CONCAT17(-(cStack_21 < cVar23),
                      CONCAT16(-(cStack_22 < cVar23),
                               CONCAT15(-(cStack_23 < cVar23),
                                        CONCAT14(-(cStack_24 < cVar23),
                                                 CONCAT13(-(cStack_25 < cVar23),
                                                          CONCAT12(-(cStack_26 < cVar23),
                                                                   CONCAT11(-(cStack_27 < cVar23),
                                                                            -(local_28 < cVar23)))))
                                       ))) |
             CONCAT17(-(cVar24 < cStack_d1),
                      CONCAT16(-(cVar24 < cStack_d2),
                               CONCAT15(-(cVar24 < cStack_d3),
                                        CONCAT14(-(cVar24 < cStack_d4),
                                                 CONCAT13(-(cVar24 < cStack_d5),
                                                          CONCAT12(-(cVar24 < cStack_d6),
                                                                   CONCAT11(-(cVar24 < cStack_d7),
                                                                            -(cVar24 < local_d8)))))
                                       )));
        if ((((((((((((((((auVar18 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar18 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar18 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar18 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar18 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar18 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar18 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar18 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (alVar32[0] >> 7 & 1) != 0) || (alVar32[0] >> 0xf & 1) != 0) ||
                (alVar32[0] >> 0x17 & 1) != 0) || (alVar32[0] >> 0x1f & 1) != 0) ||
              (alVar32[0] >> 0x27 & 1) != 0) || (alVar32[0] >> 0x2f & 1) != 0) ||
            (alVar32[0] >> 0x37 & 1) != 0) || (long)alVar32[0] < 0) {
          *(uint *)&_segNum->field_0xc = *(uint *)&_segNum->field_0xc | 0x40;
          local_43b = '\0';
          matrix._4_4_ = 0;
          matrix._0_4_ = 0;
        }
        *(int *)&_segNum->s1 = (int)local_43b;
        *(int *)((long)&_segNum->s1 + 4) = matrix._4_4_;
        _segNum->s1Len = (int)matrix;
        parasail_free(ptr_00);
        parasail_free(ptr);
        parasail_free(pvE);
        parasail_free(pvHLoad);
        profile_local = _segNum;
      }
    }
  }
  return (parasail_result_t *)profile_local;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    int8_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int8_t NEG_LIMIT = 0;
    int8_t POS_LIMIT = 0;
    int8_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile8.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 16; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile8.score;
    vGapO = _mm_set1_epi8(open);
    vGapE = _mm_set1_epi8(gap);
    NEG_LIMIT = (-open < matrix->min ? INT8_MIN + open : INT8_MIN - matrix->min) + 1;
    POS_LIMIT = INT8_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi8(NEG_LIMIT);
    vPosLimit = _mm_set1_epi8(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm_cmpeq_epi8(_mm_set1_epi8(position),
            _mm_set_epi8(0,1,2,3,4,5,6,7,8,9,10,11,12,13,14,15));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_8 | PARASAIL_FLAG_LANES_16;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad =  parasail_memalign___m128i(16, segLen);
    pvE      = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int8_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_8_t h;
            __m128i_8_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT8_MIN ? INT8_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m128i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m128i vH = _mm_slli_si128(pvHStore[segLen - 1], 1);

        /* Correct part of the vProfile */
        const __m128i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m128i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm_insert_epi8_rpl(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_adds_epi8(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi8_rpl(vH, vE);
            vH = _mm_max_epi8_rpl(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi8_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi8_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi8_rpl(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi8_rpl(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm_subs_epi8(vH, vGapO);
            vE = _mm_subs_epi8(vE, vGapE);
            vE = _mm_max_epi8_rpl(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_subs_epi8(vF, vGapE);
            vF = _mm_max_epi8_rpl(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int8_t tmp2 = tmp < INT8_MIN ? INT8_MIN : tmp;
            vF = _mm_slli_si128(vF, 1);
            vF = _mm_insert_epi8_rpl(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi8_rpl(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi8_rpl(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi8_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm_subs_epi8(vH, vGapO);
                vF = _mm_subs_epi8(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi8(vF, vH))) goto end;
                /*vF = _mm_max_epi8_rpl(vF, vH);*/
            }
        }
end:
        {
            /* extract vector containing last value from the column */
            __m128i vCompare;
            vH = _mm_load_si128(pvHStore + offset);
            vCompare = _mm_and_si128(vPosMask, _mm_cmpgt_epi8(vH, vMaxH));
            vMaxH = _mm_max_epi8_rpl(vH, vMaxH);
            if (_mm_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 1);
            }
            result->rowcols->score_row[j] = (int8_t) _mm_extract_epi8_rpl (vH, 15);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 1);
        }
        score = (int8_t) _mm_extract_epi8_rpl(vMaxH, 15);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int8_t *t = (int8_t*)pvHStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m128i vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 1);
            }
            score = (int8_t) _mm_extract_epi8_rpl (vH, 15);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi8(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi8(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}